

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omd2omdCmd.cpp
# Opt level: O2

void exchange(char **argv,custom_getopt_data *d)

{
  char *pcVar1;
  int iVar2;
  int i;
  int iVar3;
  ulong uVar4;
  char **ppcVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  
  iVar2 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
  iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
  iVar8 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
  do {
    uVar6 = iVar7 - _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7;
    uVar11 = 0;
    if (0 < (int)uVar6) {
      uVar11 = (ulong)uVar6;
    }
    ppcVar5 = argv + iVar8;
    iVar9 = (iVar8 - _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) + iVar7;
    uVar10 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 - iVar8;
    while( true ) {
      if ((iVar7 <= _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) ||
         (iVar3 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 - iVar8,
         iVar3 == 0 || _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 < iVar8)) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
             (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 -
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) + iVar2;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = iVar2;
        return;
      }
      if (iVar3 < (int)uVar6) break;
      for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
        pcVar1 = ppcVar5[uVar4];
        ppcVar5[uVar4] = argv[(long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 + uVar4];
        argv[(long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 + uVar4] = pcVar1;
      }
      iVar8 = iVar8 + uVar6;
      ppcVar5 = ppcVar5 + (int)uVar6;
      iVar9 = iVar9 + uVar6;
      uVar10 = uVar10 + (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 - iVar7);
    }
    iVar7 = iVar7 - iVar3;
    if ((int)uVar10 < 1) {
      uVar10 = 0;
    }
    for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      pcVar1 = ppcVar5[uVar11];
      ppcVar5[uVar11] = argv[(long)iVar9 + uVar11];
      argv[(long)iVar9 + uVar11] = pcVar1;
    }
  } while( true );
}

Assistant:

static void exchange(char **argv, struct custom_getopt_data *d)
{
	int bottom = d->first_nonopt;
	int middle = d->last_nonopt;
	int top = d->custom_optind;
	char *tem;

	/*
	 * Exchange the shorter segment with the far end of the longer segment.
	 * That puts the shorter segment into the right place.  It leaves the
	 * longer segment in the right place overall, but it consists of two
	 * parts that need to be swapped next.
	 */
	while (top > middle && middle > bottom) {
		if (top - middle > middle - bottom) {
			/* Bottom segment is the short one.  */
			int len = middle - bottom;
			int i;

			/* Swap it with the top part of the top segment.  */
			for (i = 0; i < len; i++) {
				tem = argv[bottom + i];
				argv[bottom + i] =
					argv[top - (middle - bottom) + i];
				argv[top - (middle - bottom) + i] = tem;
			}
			/* Exclude the moved bottom segment from further swapping.  */
			top -= len;
		} else {
			/* Top segment is the short one.  */
			int len = top - middle;
			int i;

			/* Swap it with the bottom part of the bottom segment.  */
			for (i = 0; i < len; i++) {
				tem = argv[bottom + i];
				argv[bottom + i] = argv[middle + i];
				argv[middle + i] = tem;
			}
			/* Exclude the moved top segment from further swapping.  */
			bottom += len;
		}
	}
	/* Update records for the slots the non-options now occupy.  */
	d->first_nonopt += (d->custom_optind - d->last_nonopt);
	d->last_nonopt = d->custom_optind;
}